

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileClasses.cpp
# Opt level: O0

string * __thiscall TextFile::readLine_abi_cxx11_(string *__return_storage_ptr__,TextFile *this)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  char32_t local_20;
  char32_t value;
  TextFile *this_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  bVar1 = isOpen(this);
  if (bVar1) {
    while( true ) {
      lVar2 = tell(this);
      lVar3 = size(this);
      bVar1 = false;
      if (lVar2 < lVar3) {
        local_20 = readCharacter(this);
        bVar1 = local_20 != L'\n';
      }
      if (!bVar1) break;
      anon_unknown.dwarf_11a4a1::encodeUtf8(__return_storage_ptr__,local_20);
    }
  }
  this->lineCount = this->lineCount + 1;
  return __return_storage_ptr__;
}

Assistant:

std::string TextFile::readLine()
{
	std::string result;
	char32_t value;

	if (isOpen())
	{
		while (tell() < size() && (value = readCharacter()) != L'\n')
		{
			encodeUtf8(result, value);
		}
	}

	lineCount++;
	return result;
}